

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

void stbiw__jpg_DCT(float *d0p,float *d1p,float *d2p,float *d3p,float *d4p,float *d5p,float *d6p,
                   float *d7p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  fVar1 = *d0p + *d7p;
  fVar8 = *d0p - *d7p;
  fVar2 = *d1p + *d6p;
  fVar9 = *d1p - *d6p;
  fVar3 = *d2p + *d5p;
  fVar10 = *d2p - *d5p;
  fVar4 = *d3p + *d4p;
  fVar5 = fVar1 + fVar4;
  fVar6 = fVar3 + fVar2;
  fVar1 = fVar1 - fVar4;
  fVar4 = (*d3p - *d4p) + fVar10;
  fVar7 = fVar9 + fVar8;
  fVar3 = ((fVar2 - fVar3) + fVar1) * 0.70710677;
  auVar12 = ZEXT416((uint)((fVar4 - fVar7) * 0.38268343));
  auVar11 = vfmadd132ss_fma(ZEXT416((uint)fVar4),auVar12,ZEXT416(0x3f0a8bd4));
  auVar12 = vfmadd231ss_fma(auVar12,ZEXT416((uint)fVar7),ZEXT416(0x3fa73d75));
  fVar4 = (fVar10 + fVar9) * 0.70710677;
  fVar2 = fVar8 + fVar4;
  fVar8 = fVar8 - fVar4;
  *d5p = fVar8 + auVar11._0_4_;
  *d3p = fVar8 - auVar11._0_4_;
  *d1p = fVar2 + auVar12._0_4_;
  *d7p = fVar2 - auVar12._0_4_;
  *d0p = fVar6 + fVar5;
  *d2p = fVar1 + fVar3;
  *d4p = fVar5 - fVar6;
  *d6p = fVar1 - fVar3;
  return;
}

Assistant:

static void stbiw__jpg_DCT(float *d0p, float *d1p, float *d2p, float *d3p, float *d4p, float *d5p, float *d6p, float *d7p) {
   float d0 = *d0p, d1 = *d1p, d2 = *d2p, d3 = *d3p, d4 = *d4p, d5 = *d5p, d6 = *d6p, d7 = *d7p;
   float z1, z2, z3, z4, z5, z11, z13;

   float tmp0 = d0 + d7;
   float tmp7 = d0 - d7;
   float tmp1 = d1 + d6;
   float tmp6 = d1 - d6;
   float tmp2 = d2 + d5;
   float tmp5 = d2 - d5;
   float tmp3 = d3 + d4;
   float tmp4 = d3 - d4;

   // Even part
   float tmp10 = tmp0 + tmp3;   // phase 2
   float tmp13 = tmp0 - tmp3;
   float tmp11 = tmp1 + tmp2;
   float tmp12 = tmp1 - tmp2;

   d0 = tmp10 + tmp11;       // phase 3
   d4 = tmp10 - tmp11;

   z1 = (tmp12 + tmp13) * 0.707106781f; // c4
   d2 = tmp13 + z1;       // phase 5
   d6 = tmp13 - z1;

   // Odd part
   tmp10 = tmp4 + tmp5;       // phase 2
   tmp11 = tmp5 + tmp6;
   tmp12 = tmp6 + tmp7;

   // The rotator is modified from fig 4-8 to avoid extra negations.
   z5 = (tmp10 - tmp12) * 0.382683433f; // c6
   z2 = tmp10 * 0.541196100f + z5; // c2-c6
   z4 = tmp12 * 1.306562965f + z5; // c2+c6
   z3 = tmp11 * 0.707106781f; // c4

   z11 = tmp7 + z3;      // phase 5
   z13 = tmp7 - z3;

   *d5p = z13 + z2;         // phase 6
   *d3p = z13 - z2;
   *d1p = z11 + z4;
   *d7p = z11 - z4;

   *d0p = d0;  *d2p = d2;  *d4p = d4;  *d6p = d6;
}